

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

bool __thiscall
Rml::DataExpression::Run
          (DataExpression *this,DataExpressionInterface *expression_interface,Variant *out_value)

{
  bool bVar1;
  DataInterpreter interpreter;
  Variant local_d0;
  DataInterpreter local_a8;
  
  DataInterpreter::DataInterpreter(&local_a8,&this->program,&this->addresses,*expression_interface);
  bVar1 = DataInterpreter::Run(&local_a8);
  if (bVar1) {
    Variant::Variant(&local_d0,&local_a8.R);
    Variant::operator=(out_value,&local_d0);
    Variant::~Variant(&local_d0);
  }
  DataInterpreter::~DataInterpreter(&local_a8);
  return bVar1;
}

Assistant:

bool DataExpression::Run(const DataExpressionInterface& expression_interface, Variant& out_value)
{
	DataInterpreter interpreter(program, addresses, expression_interface);

	if (!interpreter.Run())
		return false;

	out_value = interpreter.Result();
	return true;
}